

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int detectPresence(char *aExecutable)

{
  size_t sVar1;
  FILE *__stream;
  char *pcVar2;
  undefined8 uVar3;
  char lBuff [1024];
  char lTestedString [1024];
  char local_818 [2];
  char cStack_816;
  char local_418 [6];
  undefined8 auStack_412 [127];
  
  uVar3 = 0;
  memset(local_418,0,0x400);
  builtin_strncpy(local_418,"which ",6);
  strcat(local_418,aExecutable);
  sVar1 = strlen(local_418);
  builtin_strncpy(local_418 + sVar1," 2>/dev/",8);
  *(undefined8 *)((long)auStack_412 + sVar1) = 0x206c6c756e2f76;
  __stream = popen(local_418,"r");
  pcVar2 = fgets(local_818,0x400,__stream);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strchr(local_818,0x3a);
    if ((pcVar2 == (char *)0x0) && (cStack_816 != ' ' || (short)_local_818 != 0x6f6e)) {
      pclose(__stream);
      uVar3 = 1;
      goto LAB_0011a6aa;
    }
  }
  pclose(__stream);
LAB_0011a6aa:
  if (tinyfd_verbose != 0) {
    printf("detectPresence %s %d\n",aExecutable,uVar3);
  }
  return (int)uVar3;
}

Assistant:

static int detectPresence( char const * const aExecutable )
{
        char lBuff [MAX_PATH_OR_CMD] ;
        char lTestedString [MAX_PATH_OR_CMD] = "which " ;
        FILE * lIn ;

    strcat( lTestedString , aExecutable ) ;
        strcat( lTestedString, " 2>/dev/null ");
    lIn = popen( lTestedString , "r" ) ;
    if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                && ( ! strchr( lBuff , ':' ) )
                && ( strncmp(lBuff, "no ", 3) ) )
    {   /* present */
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 1);
        return 1 ;
    }
    else
    {
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 0);
        return 0 ;
    }
}